

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O0

void CSOAA::compute_wap_values
               (vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> *costs)

{
  float fVar1;
  reference ppwVar2;
  size_type sVar3;
  __normal_iterator<COST_SENSITIVE::wclass_**,_std::vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>_>
  in_RDI;
  float fVar4;
  size_t i;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  float local_34;
  _func_bool_wclass_ptr_wclass_ptr *in_stack_ffffffffffffffd0;
  __normal_iterator<COST_SENSITIVE::wclass_**,_std::vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>_>
  in_stack_ffffffffffffffe0;
  ulong uVar5;
  ulong __n;
  
  std::vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>::begin
            ((vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> *)
             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  std::vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>::end
            ((vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> *)
             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  std::
  sort<__gnu_cxx::__normal_iterator<COST_SENSITIVE::wclass**,std::vector<COST_SENSITIVE::wclass*,std::allocator<COST_SENSITIVE::wclass*>>>,bool(*)(COST_SENSITIVE::wclass_const*,COST_SENSITIVE::wclass_const*)>
            (in_stack_ffffffffffffffe0,in_RDI,in_stack_ffffffffffffffd0);
  ppwVar2 = std::vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>::
            operator[]((vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>
                        *)in_RDI._M_current,0);
  (*ppwVar2)->wap_value = 0.0;
  uVar5 = 1;
  while (__n = uVar5,
        sVar3 = std::vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>::
                size((vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> *)
                     in_RDI._M_current), uVar5 < sVar3) {
    ppwVar2 = std::vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>::
              operator[]((vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>
                          *)in_RDI._M_current,__n - 1);
    fVar4 = (*ppwVar2)->wap_value;
    ppwVar2 = std::vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>::
              operator[]((vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>
                          *)in_RDI._M_current,__n);
    fVar1 = (*ppwVar2)->x;
    ppwVar2 = std::vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>::
              operator[]((vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>
                          *)in_RDI._M_current,__n - 1);
    local_34 = (float)__n;
    fVar4 = fVar4 + (fVar1 - (*ppwVar2)->x) / local_34;
    ppwVar2 = std::vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>::
              operator[]((vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>
                          *)in_RDI._M_current,__n);
    (*ppwVar2)->wap_value = fVar4;
    uVar5 = __n + 1;
  }
  return;
}

Assistant:

void compute_wap_values(vector<COST_SENSITIVE::wclass*> costs)
{
  std::sort(costs.begin(), costs.end(), cmp_wclass_ptr);
  costs[0]->wap_value = 0.;
  for (size_t i = 1; i < costs.size(); i++)
    costs[i]->wap_value = costs[i - 1]->wap_value + (costs[i]->x - costs[i - 1]->x) / (float)i;
}